

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

string * __thiscall
MetaCommand::GetValueAsString
          (string *__return_storage_ptr__,MetaCommand *this,string *optionName,string *fieldName)

{
  pointer pcVar1;
  pointer pOVar2;
  size_t sVar3;
  pointer pFVar4;
  undefined1 *__s2;
  int iVar5;
  pointer pFVar6;
  pointer pOVar7;
  string fieldname;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_58 = local_48;
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_58);
  }
  __s2 = local_58;
  pOVar7 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar7 != pOVar2) {
    local_38 = optionName->_M_string_length;
    do {
      sVar3 = (pOVar7->name)._M_string_length;
      if ((sVar3 == local_38) &&
         ((sVar3 == 0 ||
          (iVar5 = bcmp((pOVar7->name)._M_dataplus._M_p,(optionName->_M_dataplus)._M_p,sVar3),
          iVar5 == 0)))) {
        pFVar4 = (pOVar7->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pFVar6 = (pOVar7->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar4;
            pFVar6 = pFVar6 + 1) {
          sVar3 = (pFVar6->name)._M_string_length;
          if ((sVar3 == local_50) &&
             ((sVar3 == 0 || (iVar5 = bcmp((pFVar6->name)._M_dataplus._M_p,__s2,sVar3), iVar5 == 0))
             )) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar1 = (pFVar6->value)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar1,
                       pcVar1 + (pFVar6->value)._M_string_length);
            goto LAB_0011a514;
          }
        }
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0011a514:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(METAIO_STL::string optionName,
                                          METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (*itField).value;
          }
        ++itField;
        }
      }
    ++it;
    }
  return "";
}